

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O0

int raviX_ptrlist_replace(PtrList **self,void *old_ptr,void *new_ptr,int count)

{
  void *local_48;
  void *ptr;
  PtrListIterator iter;
  int count_local;
  void *new_ptr_local;
  void *old_ptr_local;
  PtrList **self_local;
  
  iter._20_4_ = count;
  raviX_ptrlist_forward_iterator((PtrListIterator *)&ptr,*self);
  local_48 = raviX_ptrlist_iter_next((PtrListIterator *)&ptr);
  while (local_48 != (void *)0x0) {
    if (local_48 == old_ptr) {
      raviX_ptrlist_iter_set((PtrListIterator *)&ptr,new_ptr);
      iter._20_4_ = iter._20_4_ + -1;
      if (iter._20_4_ == 0) {
        return 0;
      }
    }
    local_48 = raviX_ptrlist_iter_next((PtrListIterator *)&ptr);
  }
  if ((int)iter._20_4_ < 1) {
    return iter._20_4_;
  }
  __assert_fail("count <= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                ,0x152,"int raviX_ptrlist_replace(PtrList **, void *, void *, int)");
}

Assistant:

int raviX_ptrlist_replace(PtrList **self, void *old_ptr, void *new_ptr, int count)
{
	PtrListIterator iter = raviX_ptrlist_forward_iterator(*self);
	for (void *ptr = raviX_ptrlist_iter_next(&iter); ptr != NULL; ptr = raviX_ptrlist_iter_next(&iter)) {
		if (ptr == old_ptr) {
			raviX_ptrlist_iter_set(&iter, new_ptr);
			if (!--count)
				goto out;
		}
	}
	assert(count <= 0);
out:
	return count;
}